

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.cpp
# Opt level: O3

void __thiscall Imf_3_4::HalfLut::apply(HalfLut *this,Slice *data,Box2i *dataWindow)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  half *phVar8;
  int iVar9;
  int iVar10;
  ushort *puVar11;
  char *pcVar12;
  
  iVar9 = (dataWindow->min).y;
  iVar1 = (dataWindow->max).y;
  if (iVar9 <= iVar1) {
    sVar6 = data->yStride;
    iVar2 = data->ySampling;
    pcVar12 = data->base + (long)(iVar9 / iVar2) * sVar6;
    sVar7 = data->xStride;
    iVar3 = (dataWindow->min).x;
    iVar4 = (dataWindow->max).x;
    iVar5 = data->xSampling;
    phVar8 = (this->_lut)._lut;
    do {
      if (iVar3 <= iVar4) {
        puVar11 = (ushort *)(pcVar12 + (long)(iVar3 / iVar5) * sVar7);
        iVar10 = iVar3;
        do {
          *puVar11 = phVar8[*puVar11]._h;
          puVar11 = (ushort *)((long)puVar11 + sVar7);
          iVar10 = iVar10 + iVar5;
        } while (iVar10 <= iVar4);
      }
      pcVar12 = pcVar12 + sVar6;
      iVar9 = iVar9 + iVar2;
    } while (iVar9 <= iVar1);
  }
  return;
}

Assistant:

void
HalfLut::apply (
    const Slice& data, const IMATH_NAMESPACE::Box2i& dataWindow) const
{
    assert (data.type == HALF);
    assert (dataWindow.min.x % data.xSampling == 0);
    assert (dataWindow.min.y % data.ySampling == 0);
    assert ((dataWindow.max.x - dataWindow.min.x + 1) % data.xSampling == 0);
    assert ((dataWindow.max.y - dataWindow.min.y + 1) % data.ySampling == 0);

    char* base = data.base + data.yStride * (dataWindow.min.y / data.ySampling);

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += data.ySampling)
    {
        char* pixel = base + data.xStride * (dataWindow.min.x / data.xSampling);

        for (int x = dataWindow.min.x; x <= dataWindow.max.x;
             x += data.xSampling)
        {
            *(half*) pixel = _lut (*(half*) pixel);
            pixel += data.xStride;
        }

        base += data.yStride;
    }
}